

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O3

void __thiscall QWaitCondition::~QWaitCondition(QWaitCondition *this)

{
  int iVar1;
  
  iVar1 = pthread_cond_destroy((pthread_cond_t *)&this->d->cond);
  if (iVar1 != 0) {
    qErrnoWarning(iVar1,"%s: %s failure","QWaitCondition","cv destroy");
  }
  iVar1 = pthread_mutex_destroy((pthread_mutex_t *)this->d);
  if (iVar1 != 0) {
    qErrnoWarning(iVar1,"%s: %s failure","QWaitCondition","mutex destroy");
  }
  operator_delete(this->d,0x60);
  return;
}

Assistant:

QWaitCondition::~QWaitCondition()
{
    qt_report_pthread_error(pthread_cond_destroy(&d->cond), "QWaitCondition", "cv destroy");
    qt_report_pthread_error(pthread_mutex_destroy(&d->mutex), "QWaitCondition", "mutex destroy");
    delete d;
}